

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void duckdb::LogFun::GetFunctions(void)

{
  BaseScalarFunction *pBVar1;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *function;
  long lVar2;
  BaseScalarFunction *function_00;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_421;
  _Function_base local_420;
  code *local_408;
  _Function_base local_400;
  code *local_3e8;
  LogicalType local_3e0 [24];
  LogicalType local_3c8 [24];
  LogicalType local_3b0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_398;
  LogicalType local_380 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_368;
  LogicalType local_350 [24];
  LogicalType local_338 [24];
  ScalarFunction local_320;
  ScalarFunction local_1f8;
  BaseScalarFunction local_d0 [176];
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_3e0,DOUBLE);
  __l._M_len = 1;
  __l._M_array = local_3e0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_368,__l,&local_421);
  duckdb::LogicalType::LogicalType(local_380,DOUBLE);
  local_400._M_functor._8_8_ = 0;
  local_400._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<double,double,duckdb::Log10Operator>;
  local_3e8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_400._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_338,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_1f8,&local_368,local_380,&local_400,0,0,0,0,local_338,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_1f8);
  ScalarFunction::~ScalarFunction(&local_1f8);
  duckdb::LogicalType::~LogicalType(local_338);
  std::_Function_base::~_Function_base(&local_400);
  duckdb::LogicalType::~LogicalType(local_380);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_368);
  duckdb::LogicalType::~LogicalType(local_3e0);
  duckdb::LogicalType::LogicalType(local_3e0,DOUBLE);
  duckdb::LogicalType::LogicalType(local_3c8,DOUBLE);
  __l_00._M_len = 2;
  __l_00._M_array = local_3e0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_398,__l_00,&local_421);
  duckdb::LogicalType::LogicalType(local_3b0,DOUBLE);
  local_420._M_functor._8_8_ = 0;
  local_420._M_functor._M_unused._M_function_pointer =
       ScalarFunction::BinaryFunction<double,double,double,duckdb::LogBaseOperator>;
  local_408 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_420._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_350,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_320,&local_398,local_3b0,&local_420,0,0,0,0,local_350,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_320);
  ScalarFunction::~ScalarFunction(&local_320);
  duckdb::LogicalType::~LogicalType(local_350);
  std::_Function_base::~_Function_base(&local_420);
  duckdb::LogicalType::~LogicalType(local_3b0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_398);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_3e0 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  pBVar1 = *(BaseScalarFunction **)(in_RDI + 0x28);
  for (function_00 = *(BaseScalarFunction **)(in_RDI + 0x20); function_00 != pBVar1;
      function_00 = function_00 + 0x128) {
    BaseScalarFunction::SetReturnsError(local_d0,function_00);
    duckdb::BaseScalarFunction::~BaseScalarFunction(local_d0);
  }
  return;
}

Assistant:

ScalarFunctionSet LogFun::GetFunctions() {
	ScalarFunctionSet funcs;
	funcs.AddFunction(ScalarFunction({LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                                 ScalarFunction::UnaryFunction<double, double, Log10Operator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DOUBLE, LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                                 ScalarFunction::BinaryFunction<double, double, double, LogBaseOperator>));
	for (auto &function : funcs.functions) {
		BaseScalarFunction::SetReturnsError(function);
	}
	return funcs;
}